

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int rbcholu(double *A,int N,int stride,double *UB,double *UT)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  double *sig;
  double *col;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint rows;
  uint uVar11;
  double dVar13;
  ulong uVar12;
  
  if (N < 0x41) {
    iVar1 = rcholu(A,N,stride,UB);
  }
  else {
    rows = N - 0x40;
    uVar12 = (ulong)rows;
    __ptr = malloc(0x200);
    __ptr_00 = malloc(0x200);
    sig = (double *)malloc(uVar12 << 9);
    col = (double *)malloc(uVar12 << 9);
    uVar11 = 0x40;
    rcholu(A,0x40,stride,UB);
    pdVar2 = UT;
    pdVar4 = A;
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      pdVar6 = pdVar2;
      for (uVar7 = 0; (uint)N != uVar7; uVar7 = uVar7 + 1) {
        *pdVar6 = pdVar4[uVar7];
        pdVar6 = pdVar6 + 0x40;
      }
      pdVar4 = pdVar4 + stride;
      pdVar2 = pdVar2 + 1;
    }
    pdVar2 = A + 0x40;
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        *(double *)((long)__ptr_00 + lVar3 * 8) = UT[(ulong)(uVar11 & 0x3ffffff) * 0x40 + lVar3];
        *(undefined8 *)((long)__ptr + lVar3 * 8) = 0;
      }
      pdVar4 = UT;
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        dVar13 = 0.0;
        for (lVar8 = 0; lVar3 != lVar8; lVar8 = lVar8 + 1) {
          dVar13 = dVar13 + pdVar4[lVar8] * *(double *)((long)__ptr + lVar8 * 8);
        }
        *(double *)((long)__ptr + lVar3 * 8) =
             (*(double *)((long)__ptr_00 + lVar3 * 8) - dVar13) / UT[lVar3 * 0x41];
        pdVar4 = pdVar4 + 0x40;
      }
      pdVar4 = pdVar2;
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        dVar13 = *(double *)((long)__ptr + lVar3 * 8);
        *pdVar4 = dVar13;
        sig[(ulong)((uint)uVar7 & 0x3ffffff) * 0x40 + lVar3] = dVar13;
        pdVar4 = pdVar4 + stride;
      }
      uVar11 = uVar11 + 1;
      pdVar2 = pdVar2 + 1;
    }
    mtranspose(sig,rows,0x40,col);
    mmult(sig,col,UT,rows,0x40,rows);
    free(sig);
    free(col);
    free(__ptr_00);
    free(__ptr);
    iVar1 = stride * 0x40 + 0x40;
    uVar7 = uVar12;
    pdVar2 = UT;
    for (uVar5 = 0; uVar5 != uVar12; uVar5 = uVar5 + 1) {
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        iVar10 = iVar1 + (int)uVar9;
        A[iVar10] = A[iVar10] - pdVar2[uVar9];
      }
      pdVar2 = pdVar2 + (long)(int)rows + 1;
      iVar1 = iVar1 + stride + 1;
      uVar7 = uVar7 - 1;
    }
    iVar1 = rbcholu(A + (long)(stride * 0x40) + 0x40,rows,stride,UB,UT);
  }
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int rbcholu(double *A,int N, int stride, double *UB, double *UT) {
	int bs,bb,i,j,Nb,t,k,u,v,w,sc;
	double *b,*x,*U12,*U12T;
	double sum;
	
	bs = (int) BLOCKSIZE;
	bb = bs*bs;
	
	if (N <= BLOCKSIZE) {
		sc = rcholu(A,N,stride,UB);
		if (sc == -1) {
			return -1;
		}
	} else {
		Nb = N - bs;
		x = (double*) malloc(sizeof(double) * bs);
		b = (double*) malloc(sizeof(double) * bs);
		U12T = (double*) malloc(sizeof(double) * Nb * bs);
		U12 = (double*) malloc(sizeof(double) * Nb * bs);
		rcholu(A,bs,stride,UB); // U11
		
		for (i =0; i < bs;++i) {
			t = i *stride;
			u = 0;
			for(j = 0; j < N;++j) {
				UT[u+i] = A[j+t];
				u += bs;
			}
		}
		
		for(k = 0; k < Nb;++k) {
			u = k * bs;
			for(i = 0; i < bs;++i) {
				b[i] = UT[bb+u+i];
				x[i] = 0.;
			}
			for (i = 0; i < bs;++i) {
				t = i*bs;
				sum = 0;
				for (j = 0; j < i;++j) {
					sum += UT[t+j] * x[j];
				}
				x[i] = (b[i] - sum) / UT[t+i];
			}
			v = bs + k;
			for(i = 0; i < bs;++i) {
				A[v] = x[i];
				U12T[u+i] = x[i];
				v += stride;
			}
		}
		
		mtranspose(U12T,Nb,bs,U12);
		mmult(U12T,U12,UT,Nb,bs,Nb);
		free(U12T);
		free(U12);
		free(b);
		free(x);
		for (i = 0; i < Nb; ++i) {
			u = bs * stride + bs + i * stride;
			w = i * Nb;
			for(j = i; j < Nb;j++) {
				A[j + u] -= UT[j + w];
			}
		}
		
		sc = rbcholu(A + bs * stride + bs,Nb,stride,UB,UT);
		if (sc == -1) {
			return -1;
		}
	}
	
	return sc;
}